

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O1

void __thiscall CEcon::Update(CEcon *this)

{
  CNetConsole *this_00;
  CNetBan *pCVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64 iVar5;
  int64 iVar6;
  uint uVar7;
  int64 *piVar8;
  long lVar9;
  long in_FS_OFFSET;
  int ClientID;
  char aMsg [128];
  char aBuf [1400];
  uint local_6bc;
  char local_6b8 [256];
  char local_5b8 [1408];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_Ready == false) {
    bVar3 = Open(this);
    if (!bVar3) goto LAB_001c2e24;
  }
  this_00 = &this->m_NetConsole;
  CNetConsole::Update(this_00);
  iVar4 = CNetConsole::Recv(this_00,local_5b8,0x577,(int *)&local_6bc);
  if (iVar4 != 0) {
    do {
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/econ.cpp"
                     ,0x95,(uint)(this->m_aClients[(int)local_6bc].m_State != 0),
                     "got message from empty slot");
      iVar4 = this->m_aClients[(int)local_6bc].m_State;
      if (iVar4 == 2) {
        str_format(local_6b8,0x100,"cid=%d cmd=\'%s\'",(long)(int)local_6bc,local_5b8);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,1,"server",local_6b8,0);
        this->m_UserClientID = local_6bc;
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x13])(this->m_pConsole,local_5b8);
        this->m_UserClientID = -1;
      }
      else if (iVar4 == 1) {
        iVar4 = str_comp(local_5b8,this->m_pConfig->m_EcPassword);
        lVar9 = (long)(int)local_6bc;
        if (iVar4 == 0) {
          this->m_aClients[lVar9].m_State = 2;
          CNetConsole::Send(this_00,local_6bc,
                            "Authentication successful. External console access granted.");
          net_addr_str(&(this->m_NetConsole).m_aSlots[(int)local_6bc].m_Connection.m_PeerAddr,
                       local_6b8,0x30,1);
          str_format(local_5b8,0x578,"cid=%d addr=%s  authed",(ulong)local_6bc,local_6b8);
          (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                    (this->m_pConsole,0,"econ",local_5b8,0);
        }
        else {
          uVar7 = this->m_aClients[lVar9].m_AuthTries + 1;
          this->m_aClients[lVar9].m_AuthTries = uVar7;
          str_format(local_6b8,0x80,"Wrong password %d/%d.",(ulong)uVar7,3);
          CNetConsole::Send(this_00,local_6bc,local_6b8);
          if (2 < this->m_aClients[(int)local_6bc].m_AuthTries) {
            iVar4 = this->m_pConfig->m_EcBantime;
            if (iVar4 != 0) {
              pCVar1 = (this->m_NetConsole).m_pNetBan;
              (*pCVar1->_vptr_CNetBan[2])
                        (pCVar1,&(this->m_NetConsole).m_aSlots[(int)local_6bc].m_Connection.
                                 m_PeerAddr,(ulong)(uint)(iVar4 * 0x3c),
                         "Too many authentication tries");
            }
            CNetConsole::Drop(this_00,local_6bc,"Too many authentication tries");
          }
        }
      }
      iVar4 = CNetConsole::Recv(this_00,local_5b8,0x577,(int *)&local_6bc);
    } while (iVar4 != 0);
  }
  piVar8 = &this->m_aClients[0].m_TimeConnected;
  lVar9 = 0;
  do {
    if (((CClient *)(piVar8 + -1))->m_State == 1) {
      iVar5 = time_get();
      lVar2 = *piVar8;
      iVar4 = this->m_pConfig->m_EcAuthTimeout;
      iVar6 = time_freq();
      if (iVar6 * iVar4 + lVar2 < iVar5) {
        CNetConsole::Drop(this_00,(int)lVar9,"authentication timeout");
      }
    }
    lVar9 = lVar9 + 1;
    piVar8 = piVar8 + 3;
  } while (lVar9 != 4);
LAB_001c2e24:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEcon::Update()
{
	if(!m_Ready && !Open())
		return;	

	m_NetConsole.Update();

	char aBuf[NET_MAX_PACKETSIZE];
	int ClientID;

	while(m_NetConsole.Recv(aBuf, (int)(sizeof(aBuf))-1, &ClientID))
	{
		dbg_assert(m_aClients[ClientID].m_State != CClient::STATE_EMPTY, "got message from empty slot");
		if(m_aClients[ClientID].m_State == CClient::STATE_CONNECTED)
		{
			if(str_comp(aBuf, m_pConfig->m_EcPassword) == 0)
			{
				m_aClients[ClientID].m_State = CClient::STATE_AUTHED;
				m_NetConsole.Send(ClientID, "Authentication successful. External console access granted.");

				char aAddrStr[NETADDR_MAXSTRSIZE];
				net_addr_str(m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
				str_format(aBuf, sizeof(aBuf), "cid=%d addr=%s  authed", ClientID, aAddrStr);
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "econ", aBuf);
			}
			else
			{
				m_aClients[ClientID].m_AuthTries++;
				char aMsg[128];
				str_format(aMsg, sizeof(aMsg), "Wrong password %d/%d.", m_aClients[ClientID].m_AuthTries, MAX_AUTH_TRIES);
				m_NetConsole.Send(ClientID, aMsg);
				if(m_aClients[ClientID].m_AuthTries >= MAX_AUTH_TRIES)
				{
					if(m_pConfig->m_EcBantime)
						m_NetConsole.NetBan()->BanAddr(m_NetConsole.ClientAddr(ClientID), m_pConfig->m_EcBantime*60, "Too many authentication tries");
					m_NetConsole.Drop(ClientID, "Too many authentication tries");
				}
			}
		}
		else if(m_aClients[ClientID].m_State == CClient::STATE_AUTHED)
		{
			char aFormatted[256];
			str_format(aFormatted, sizeof(aFormatted), "cid=%d cmd='%s'", ClientID, aBuf);
			Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "server", aFormatted);
			m_UserClientID = ClientID;
			Console()->ExecuteLine(aBuf);
			m_UserClientID = -1;
		}
	}

	for(int i = 0; i < NET_MAX_CONSOLE_CLIENTS; ++i)
	{
		if(m_aClients[i].m_State == CClient::STATE_CONNECTED &&
			time_get() > m_aClients[i].m_TimeConnected + m_pConfig->m_EcAuthTimeout * time_freq())
			m_NetConsole.Drop(i, "authentication timeout");
	}
}